

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * __thiscall
minja::Value::call(Value *__return_storage_ptr__,Value *this,shared_ptr<minja::Context> *context,
                  ArgumentsValue *args)

{
  _Any_data *p_Var1;
  runtime_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  p_Var1 = (_Any_data *)
           (this->callable_).
           super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (p_Var1 == (_Any_data *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    dump_abi_cxx11_(&sStack_58,this,-1,false);
    std::operator+(&local_38,"Value is not callable: ",&sStack_58);
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(long *)(p_Var1 + 1) != 0) {
    (**(code **)((long)p_Var1 + 0x18))(__return_storage_ptr__,p_Var1,context,args);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

Value call(const std::shared_ptr<Context> & context, ArgumentsValue & args) const {
    if (!callable_) throw std::runtime_error("Value is not callable: " + dump());
    return (*callable_)(context, args);
  }